

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_TIMED_DEC(effect_handler_context_t_conflict *context)

{
  wchar_t wVar1;
  byte can_disturb;
  wchar_t v;
  wchar_t idx;
  
  wVar1 = effect_calculate_value(context,false);
  if (context->other == 0) {
    idx = context->subtype;
  }
  else {
    idx = context->subtype;
    wVar1 = (int)player->timed[idx] / context->other;
  }
  can_disturb = true;
  if ((context->origin).what == SRC_PLAYER) {
    can_disturb = context->aware ^ 1;
  }
  v = L'\0';
  if (L'\0' < wVar1) {
    v = wVar1;
  }
  player_dec_timed(player,idx,v,true,(_Bool)can_disturb);
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_TIMED_DEC(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	if (context->other)
		amount = player->timed[context->subtype] / context->other;
	(void) player_dec_timed(player, context->subtype, MAX(amount, 0), true,
		context->origin.what != SRC_PLAYER || !context->aware);
	context->ident = true;
	return true;
}